

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrologEncoderMD.cpp
# Opt level: O1

size_t PrologEncoderMD::GetAllocaSize(Instr *instr)

{
  Opnd *pOVar1;
  code *pcVar2;
  bool bVar3;
  OpndKind OVar4;
  undefined4 *puVar5;
  
  if (instr->m_opcode != SUB) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x66,"(instr->m_opcode == Js::OpCode::SUB)",
                       "instr->m_opcode == Js::OpCode::SUB");
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  if ((instr->m_src1 == (Opnd *)0x0) || (instr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x67,"(instr->GetSrc1() && instr->GetSrc2())",
                       "instr->GetSrc1() && instr->GetSrc2()");
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  pOVar1 = instr->m_src1;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  if (*(byte *)((long)&pOVar1[1].m_valueType.field_0.bits + 1) == 5) {
    OVar4 = IR::Opnd::GetKind(instr->m_src2);
    if (OVar4 != OpndKindIntConst) goto LAB_00654aa4;
  }
  else {
LAB_00654aa4:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x69,
                       "(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd())"
                       ,
                       "instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP && instr->GetSrc2()->IsIntConstOpnd()"
                      );
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  pOVar1 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  if (((ulong)pOVar1[1]._vptr_Opnd & 7) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/amd64/PrologEncoderMD.cpp"
                       ,0x6a,"(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0)",
                       "instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0");
    if (!bVar3) goto LAB_00654c26;
    *puVar5 = 0;
  }
  pOVar1 = instr->m_src2;
  OVar4 = IR::Opnd::GetKind(pOVar1);
  if (OVar4 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar3) {
LAB_00654c26:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return (size_t)pOVar1[1]._vptr_Opnd;
}

Assistant:

size_t PrologEncoderMD::GetAllocaSize(IR::Instr *instr)
{
    Assert(instr->m_opcode == Js::OpCode::SUB);
    Assert(instr->GetSrc1() && instr->GetSrc2());
    Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() == RegRSP &&
           instr->GetSrc2()->IsIntConstOpnd());
    Assert(instr->GetSrc2()->AsIntConstOpnd()->GetValue() % 8 == 0);

    return instr->GetSrc2()->AsIntConstOpnd()->GetValue();
}